

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.c
# Opt level: O0

void den_terms_ci(float64 **d_term,float64 post_j,float64 *p_ci_op,float64 **den,uint32 **den_idx,
                 float32 **mixw,uint32 n_feat,uint32 n_top)

{
  double dVar1;
  float64 inv_ci_op;
  uint32 kk;
  uint32 k;
  uint32 j;
  uint32 n_feat_local;
  float32 **mixw_local;
  uint32 **den_idx_local;
  float64 **den_local;
  float64 *p_ci_op_local;
  float64 post_j_local;
  float64 **d_term_local;
  
  for (kk = 0; kk < n_feat; kk = kk + 1) {
    if (((double)p_ci_op[kk] != 0.0) || (NAN((double)p_ci_op[kk]))) {
      dVar1 = (double)p_ci_op[kk];
      for (inv_ci_op._0_4_ = 0; inv_ci_op._0_4_ < n_top; inv_ci_op._0_4_ = inv_ci_op._0_4_ + 1) {
        d_term[kk][inv_ci_op._0_4_] =
             (float64)((double)(float)mixw[kk][den_idx[kk][inv_ci_op._0_4_]] *
                       (double)den[kk][inv_ci_op._0_4_] * (1.0 / dVar1) * (double)post_j);
      }
    }
    else {
      for (inv_ci_op._0_4_ = 0; inv_ci_op._0_4_ < n_top; inv_ci_op._0_4_ = inv_ci_op._0_4_ + 1) {
        d_term[kk][inv_ci_op._0_4_] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void
den_terms_ci(float64 **d_term,

	     float64 post_j,
	     float64 *p_ci_op,
	     float64 **den,
	     uint32  **den_idx,
	     float32 **mixw,
	     uint32 n_feat,
	     uint32 n_top)
{
    uint32 j, k, kk;
    float64 inv_ci_op;

    for (j = 0; j < n_feat; j++) {
	if (p_ci_op[j] != 0) {
	    inv_ci_op = 1.0 / p_ci_op[j];

	    for (kk = 0; kk < n_top; kk++) {
		/* density index k for one of the n_top density values */
		k = den_idx[j][kk];
		
		d_term[j][kk] = mixw[j][k] * den[j][kk] * inv_ci_op * post_j;
	    }
	}
	else {
	    for (kk = 0; kk < n_top; kk++) {
		d_term[j][kk] = 0;
	    }
	}
    }
}